

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_pcode.cpp
# Opt level: O0

bool __thiscall
PcodeGenerator::CanInline(PcodeGenerator *this,string *top_label,string *bottom_label)

{
  bool bVar1;
  __type _Var2;
  PcodeType PVar3;
  pointer pPVar4;
  undefined1 local_a0 [8];
  string num1_1;
  __normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_> _Stack_78;
  PcodeType op_1;
  iterator iter_1;
  string num1;
  iterator iStack_48;
  PcodeType op;
  __normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_> local_40;
  iterator iter;
  iterator iter_bottom;
  iterator iter_top;
  string *bottom_label_local;
  string *top_label_local;
  PcodeGenerator *this_local;
  
  bVar1 = std::operator==(top_label,"main");
  if (bVar1) {
    this_local._7_1_ = 0;
  }
  else {
    __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
    __normal_iterator(&iter_bottom);
    __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
    __normal_iterator(&iter);
    local_40._M_current =
         (Pcode *)std::vector<Pcode,_std::allocator<Pcode>_>::begin(&this->m_pcode_queue);
    while( true ) {
      iStack_48 = std::vector<Pcode,_std::allocator<Pcode>_>::end(&this->m_pcode_queue);
      bVar1 = __gnu_cxx::operator!=(&local_40,&stack0xffffffffffffffb8);
      if (!bVar1) break;
      pPVar4 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
               operator->(&local_40);
      PVar3 = Pcode::GetOP(pPVar4);
      pPVar4 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
               operator->(&local_40);
      Pcode::GetNum1_abi_cxx11_((string *)&iter_1,pPVar4);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &iter_1,top_label);
      if ((_Var2) && (PVar3 == LABEL)) {
        iter_bottom._M_current = local_40._M_current;
      }
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &iter_1,bottom_label);
      if ((_Var2) && (PVar3 == LABEL)) {
        iter._M_current = local_40._M_current;
      }
      std::__cxx11::string::~string((string *)&iter_1);
      __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::operator++
                (&local_40);
    }
    _Stack_78._M_current = iter_bottom._M_current;
    while (bVar1 = __gnu_cxx::operator!=(&stack0xffffffffffffff88,&iter), bVar1) {
      pPVar4 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
               operator->(&stack0xffffffffffffff88);
      num1_1.field_2._12_4_ = Pcode::GetOP(pPVar4);
      pPVar4 = __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::
               operator->(&stack0xffffffffffffff88);
      Pcode::GetNum1_abi_cxx11_((string *)local_a0,pPVar4);
      if ((((num1_1.field_2._12_4_ == 0xe) &&
           (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_a0,"RA"), bVar1)) || (num1_1.field_2._12_4_ == 5)) ||
         (*pcode_string[(uint)num1_1.field_2._12_4_] == 'B')) {
        this_local._7_1_ = 0;
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
      std::__cxx11::string::~string((string *)local_a0);
      if (bVar1) goto LAB_001986e0;
      __gnu_cxx::__normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_>::operator++
                (&stack0xffffffffffffff88);
    }
    this_local._7_1_ = 1;
  }
LAB_001986e0:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool PcodeGenerator::CanInline(const string& top_label, const string& bottom_label) {
    if (top_label == "main")
        return false;
    vector<Pcode>::iterator iter_top;
    vector<Pcode>::iterator iter_bottom;
    auto iter = m_pcode_queue.begin();
    for (; iter != m_pcode_queue.end(); ++iter) {
        PcodeType op = iter->GetOP();
        string num1 = iter->GetNum1();
        if (num1 == top_label && op == LABEL)
            iter_top = iter;
        if (num1 == bottom_label && op == LABEL)
            iter_bottom = iter;
    }
    for (auto iter = iter_top; iter != iter_bottom; ++iter) {
        PcodeType op = iter->GetOP();
        string num1 = iter->GetNum1();
        if ((op == JUMP && num1 != "RA") || op == CALL || pcode_string[op][0] == 'B')
        //if ((op == JUMP && num1 != "RA") || op == CALL)
            return false;
    }
    return true;
}